

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupLevelized(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *__ptr;
  void *__ptr_00;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int *pNodes;
  int *pCounts;
  int nLevels;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManLevelNum(p);
  __ptr = calloc((long)(iVar1 + 1),4);
  iVar2 = Gia_ManAndNum(p);
  __ptr_00 = malloc((long)iVar2 << 2);
  pCounts._4_4_ = 0;
  while( true ) {
    bVar6 = false;
    if (pCounts._4_4_ < p->nObjs) {
      _nLevels = Gia_ManObj(p,pCounts._4_4_);
      bVar6 = _nLevels != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar2 = Gia_ObjIsAnd(_nLevels);
    if (iVar2 != 0) {
      iVar2 = Gia_ObjLevel(p,_nLevels);
      *(int *)((long)__ptr + (long)iVar2 * 4) = *(int *)((long)__ptr + (long)iVar2 * 4) + 1;
    }
    pCounts._4_4_ = pCounts._4_4_ + 1;
  }
  for (pCounts._4_4_ = 1; pCounts._4_4_ <= iVar1; pCounts._4_4_ = pCounts._4_4_ + 1) {
    *(int *)((long)__ptr + (long)pCounts._4_4_ * 4) =
         *(int *)((long)__ptr + (long)(pCounts._4_4_ + -1) * 4) +
         *(int *)((long)__ptr + (long)pCounts._4_4_ * 4);
  }
  pCounts._4_4_ = 0;
  while( true ) {
    bVar6 = false;
    if (pCounts._4_4_ < p->nObjs) {
      _nLevels = Gia_ManObj(p,pCounts._4_4_);
      bVar6 = _nLevels != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjIsAnd(_nLevels);
    if (iVar1 != 0) {
      iVar2 = Gia_ObjLevel(p,_nLevels);
      iVar1 = *(int *)((long)__ptr + (long)(iVar2 + -1) * 4);
      *(int *)((long)__ptr + (long)(iVar2 + -1) * 4) = iVar1 + 1;
      *(int *)((long)__ptr_00 + (long)iVar1 * 4) = pCounts._4_4_;
    }
    pCounts._4_4_ = pCounts._4_4_ + 1;
  }
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  pCounts._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar6 = false;
    if (pCounts._4_4_ < iVar1) {
      _nLevels = Gia_ManCi(p,pCounts._4_4_);
      bVar6 = _nLevels != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    uVar3 = Gia_ManAppendCi(p_00);
    _nLevels->Value = uVar3;
    pCounts._4_4_ = pCounts._4_4_ + 1;
  }
  pCounts._4_4_ = 0;
  while( true ) {
    iVar1 = Gia_ManAndNum(p);
    bVar6 = false;
    if (pCounts._4_4_ < iVar1) {
      _nLevels = Gia_ManObj(p,*(int *)((long)__ptr_00 + (long)pCounts._4_4_ * 4));
      bVar6 = _nLevels != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjFanin0Copy(_nLevels);
    iVar2 = Gia_ObjFanin1Copy(_nLevels);
    uVar3 = Gia_ManAppendAnd(p_00,iVar1,iVar2);
    _nLevels->Value = uVar3;
    pCounts._4_4_ = pCounts._4_4_ + 1;
  }
  pCounts._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar6 = false;
    if (pCounts._4_4_ < iVar1) {
      _nLevels = Gia_ManCo(p,pCounts._4_4_);
      bVar6 = _nLevels != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjFanin0Copy(_nLevels);
    uVar3 = Gia_ManAppendCo(p_00,iVar1);
    _nLevels->Value = uVar3;
    pCounts._4_4_ = pCounts._4_4_ + 1;
  }
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupLevelized( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, nLevels = Gia_ManLevelNum( p );
    int * pCounts = ABC_CALLOC( int, nLevels + 1 );
    int * pNodes = ABC_ALLOC( int, Gia_ManAndNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
        pCounts[Gia_ObjLevel(p, pObj)]++;
    for ( i = 1; i <= nLevels; i++ )
        pCounts[i] += pCounts[i-1];
    Gia_ManForEachAnd( p, pObj, i )
        pNodes[pCounts[Gia_ObjLevel(p, pObj)-1]++] = i;
    // duplicate
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    for ( i = 0; i < Gia_ManAndNum(p) && (pObj = Gia_ManObj(p, pNodes[i])); i++ )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    ABC_FREE( pCounts );
    ABC_FREE( pNodes );
    return pNew;
}